

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::DoGenerate(cmMakefile *this,cmLocalGenerator *lg)

{
  pointer pBVar1;
  BT<cmMakefile::GeneratorAction> *action;
  pointer this_00;
  
  ExpandVariablesCMP0019(this);
  pBVar1 = (this->GeneratorActions).
           super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->GeneratorActions).
                 super__Vector_base<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pBVar1; this_00 = this_00 + 1
      ) {
    GeneratorAction::operator()(&this_00->Value,lg,&this_00->Backtrace);
  }
  this->GeneratorActionsInvoked = true;
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,(anonymous_namespace)::file_not_persistent>
            (&this->OutputFiles);
  ::cm::
  erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,(anonymous_namespace)::file_not_persistent>
            (&this->ListFiles);
  return;
}

Assistant:

void cmMakefile::DoGenerate(cmLocalGenerator& lg)
{
  // do all the variable expansions here
  this->ExpandVariablesCMP0019();

  // give all the commands a chance to do something
  // after the file has been parsed before generation
  for (auto& action : this->GeneratorActions) {
    action.Value(lg, action.Backtrace);
  }
  this->GeneratorActionsInvoked = true;

  // go through all configured files and see which ones still exist.
  // we don't want cmake to re-run if a configured file is created and deleted
  // during processing as that would make it a transient file that can't
  // influence the build process
  cm::erase_if(this->OutputFiles, file_not_persistent());

  // if a configured file is used as input for another configured file,
  // and then deleted it will show up in the input list files so we
  // need to scan those too
  cm::erase_if(this->ListFiles, file_not_persistent());
}